

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O3

Name __thiscall wasm::Names::getValidName(Names *this,Name root,function<bool_(wasm::Name)> *check)

{
  char cVar1;
  char cVar2;
  long *plVar3;
  undefined1 reuse;
  uint uVar4;
  size_type *psVar5;
  char *pcVar6;
  ulong uVar7;
  uint __val;
  string_view sVar8;
  Name NVar9;
  string_view s;
  string_view s_00;
  char *local_a0;
  Names *local_98;
  undefined1 local_90 [8];
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefixed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  
  sVar8._M_str = local_a0;
  sVar8._M_len = (size_t)local_98;
  pcVar6 = root.super_IString.str._M_str;
  local_a0 = root.super_IString.str._M_len;
  __str.field_2._8_8_ = this;
  prefixed._M_dataplus._M_p = local_a0;
  if (*(long *)(pcVar6 + 0x10) == 0) {
    std::__throw_bad_function_call();
  }
  cVar2 = (**(code **)(pcVar6 + 0x18))(pcVar6,(undefined1 *)((long)&__str.field_2 + 8));
  if (cVar2 == '\0') {
    prefixed.field_2._8_8_ = &name._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&prefixed.field_2 + 8),local_a0,this + (long)local_a0);
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)((long)&prefixed.field_2 + 8),(ulong)name._M_dataplus._M_p,0,
                                '\x01');
    __str.field_2._8_8_ = &prefixed._M_string_length;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      prefixed._M_string_length = *psVar5;
      prefixed.field_2._M_allocated_capacity = plVar3[3];
    }
    else {
      prefixed._M_string_length = *psVar5;
      __str.field_2._8_8_ = (size_type *)*plVar3;
    }
    prefixed._M_dataplus._M_p = (pointer)plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((size_type *)prefixed.field_2._8_8_ != &name._M_string_length) {
      operator_delete((void *)prefixed.field_2._8_8_,name._M_string_length + 1);
    }
    __val = 0;
    do {
      cVar2 = '\x01';
      if (9 < __val) {
        uVar7 = (ulong)__val;
        cVar1 = '\x04';
        do {
          cVar2 = cVar1;
          uVar4 = (uint)uVar7;
          if (uVar4 < 100) {
            cVar2 = cVar2 + -2;
            goto LAB_0065beb6;
          }
          if (uVar4 < 1000) {
            cVar2 = cVar2 + -1;
            goto LAB_0065beb6;
          }
          if (uVar4 < 10000) goto LAB_0065beb6;
          uVar7 = uVar7 / 10000;
          cVar1 = cVar2 + '\x04';
        } while (99999 < uVar4);
        cVar2 = cVar2 + '\x01';
      }
LAB_0065beb6:
      local_90 = (undefined1  [8])&__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)local_90,cVar2);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_90,(uint)__str._M_dataplus._M_p,__val);
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_90,0,(char *)0x0,__str.field_2._8_8_);
      prefixed.field_2._8_8_ = &name._M_string_length;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar5) {
        name._M_string_length = *psVar5;
        name.field_2._M_allocated_capacity = plVar3[3];
      }
      else {
        name._M_string_length = *psVar5;
        prefixed.field_2._8_8_ = (size_type *)*plVar3;
      }
      name._M_dataplus._M_p = (pointer)plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_90 != (undefined1  [8])&__str._M_string_length) {
        operator_delete((void *)local_90,__str._M_string_length + 1);
      }
      s._M_str = (char *)0x0;
      s._M_len = prefixed.field_2._8_8_;
      reuse = SUB81(psVar5,0);
      _local_90 = IString::interned((IString *)name._M_dataplus._M_p,s,(bool)reuse);
      if (*(long *)(pcVar6 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      cVar2 = (**(code **)(pcVar6 + 0x18))(pcVar6,local_90);
      if (cVar2 == '\0') {
        __val = __val + 1;
      }
      else {
        s_00._M_str = (char *)0x0;
        s_00._M_len = prefixed.field_2._8_8_;
        sVar8 = IString::interned((IString *)name._M_dataplus._M_p,s_00,(bool)reuse);
      }
      local_a0 = sVar8._M_str;
      local_98 = (Names *)sVar8._M_len;
      if ((size_type *)prefixed.field_2._8_8_ != &name._M_string_length) {
        operator_delete((void *)prefixed.field_2._8_8_,name._M_string_length + 1);
      }
    } while (cVar2 == '\0');
    this = local_98;
    if ((size_type *)__str.field_2._8_8_ != &prefixed._M_string_length) {
      operator_delete((void *)__str.field_2._8_8_,prefixed._M_string_length + 1);
    }
  }
  NVar9.super_IString.str._M_str = local_a0;
  NVar9.super_IString.str._M_len = (size_t)this;
  return (Name)NVar9.super_IString.str;
}

Assistant:

inline Name getValidName(Name root, std::function<bool(Name)> check) {
  if (check(root)) {
    return root;
  }
  auto prefixed = std::string(root.str) + '_';
  Index num = 0;
  while (1) {
    auto name = prefixed + std::to_string(num);
    if (check(name)) {
      return name;
    }
    num++;
  }
}